

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  pointer *pppFVar1;
  string *psVar2;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  pointer ppFVar3;
  FieldDescriptor *pFVar4;
  iterator __position;
  undefined8 *puVar5;
  pointer piVar6;
  size_t sVar7;
  MessageGenerator *this_00;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  FieldGeneratorMap *pFVar13;
  LogMessage *pLVar14;
  FieldGenerator *pFVar15;
  ulong uVar16;
  long lVar17;
  uint32 uVar18;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  ulong uVar19;
  long lVar20;
  long *plVar21;
  byte bVar22;
  size_type *psVar23;
  int iVar24;
  uint uVar25;
  pointer ppFVar26;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar28;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Hex HVar29;
  Hex HVar30;
  LogMessage local_2f8 [56];
  LogMessage local_2c0 [56];
  LogMessage local_288 [56];
  LogMessage local_250 [56];
  LogMessage local_218 [56];
  undefined1 local_1e0 [8];
  ColdChunkSkipper cold_skipper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Iterator __end3;
  Iterator __end4;
  Iterator __begin4;
  undefined1 local_100 [8];
  Formatter format;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  undefined1 local_a8 [8];
  string chunk_mask_str;
  long local_80;
  undefined1 local_78 [40];
  uint local_50;
  undefined4 local_4c;
  Printer *local_48;
  MessageGenerator *local_40;
  int local_34 [2];
  int cached_has_word_index;
  
  local_100 = (undefined1  [8])printer;
  local_48 = printer;
  local_40 = this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  Formatter::operator()<>
            ((Formatter *)local_100,
             "void $classname$::MergeFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  $DCHK$_NE(&from, this);\n"
            );
  google::protobuf::io::Printer::Indent();
  if (0 < *(int *)(local_40->descriptor_ + 0x7c)) {
    Formatter::operator()<>((Formatter *)local_100,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  options = &local_40->options_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SetUnknkownFieldsVariable
            (local_40->descriptor_,options,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&cold_skipper.limit_chunk_);
  Formatter::AddMap((Formatter *)local_100,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&cold_skipper.limit_chunk_);
  Formatter::operator()<>
            ((Formatter *)local_100,
             "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
            );
  this_00 = local_40;
  uVar27 = 0;
  uVar28 = 0;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppFVar26 = (local_40->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (local_40->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppFVar26 == ppFVar3) {
      has_bit_indices = &local_40->has_bit_indices_;
      anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
                ((ColdChunkSkipper *)local_1e0,options,
                 (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,has_bit_indices,
                 (double)CONCAT44(uVar28,uVar27));
      local_34[0] = -1;
      if (chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pFVar13 = &local_40->field_generators_;
        uVar19 = 0;
        do {
          sVar7 = format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count;
          psVar23 = &chunk_mask_str._M_string_length;
          puVar5 = *(undefined8 **)
                    (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + uVar19 * 0x18);
          if ((ulong)(*(long *)(format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 8 +
                               uVar19 * 0x18) - (long)puVar5) < 9) {
            local_4c = 0;
          }
          else {
            iVar24 = HasBitIndex(local_40,(FieldDescriptor *)*puVar5);
            local_4c = CONCAT31((int3)(iVar24 + 7U >> 8),iVar24 + 7U < 0xfffffff8 && iVar24 != -1);
          }
          local_a8 = (undefined1  [8])psVar23;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"from.","");
          chunk_mask_str.field_2._8_8_ = local_48;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&stack0xffffffffffffff80,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&cold_skipper.cold_threshold_);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&stack0xffffffffffffff80);
          if (local_a8 != (undefined1  [8])psVar23) {
            operator_delete((void *)local_a8);
          }
          fields = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)(sVar7 + uVar19 * 0x18);
          if ((char)local_4c != '\0') {
            uVar11 = anon_unknown_0::GenChunkMask(fields,has_bit_indices);
            HVar29.value = (ulong)uVar11;
            HVar29._8_8_ = 8;
            google::protobuf::strings::AlphaNum::AlphaNum
                      ((AlphaNum *)((long)&chunk_mask_str.field_2 + 8),HVar29);
            local_a8 = (undefined1  [8])psVar23;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,chunk_mask_str.field_2._8_8_,
                       local_80 + chunk_mask_str.field_2._8_8_);
            if (uVar11 == 0) {
              bVar8 = true;
            }
            else {
              iVar24 = 0;
              uVar18 = uVar11;
              do {
                iVar24 = iVar24 + (uVar18 & 1);
                bVar8 = 1 < uVar18;
                uVar18 = uVar18 >> 1;
              } while (bVar8);
              bVar8 = iVar24 < 2;
            }
            if (bVar8) {
              google::protobuf::internal::LogMessage::LogMessage
                        (local_2f8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xca1);
              pLVar14 = (LogMessage *)
                        google::protobuf::internal::LogMessage::operator<<
                                  (local_2f8,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
              google::protobuf::internal::LogFinisher::operator=
                        ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 8),pLVar14);
              google::protobuf::internal::LogMessage::~LogMessage(local_2f8);
            }
            uVar25 = 0;
            if (uVar11 != 0) {
              do {
                uVar25 = uVar25 + (uVar11 & 1);
                bVar8 = 1 < uVar11;
                uVar11 = uVar11 >> 1;
              } while (bVar8);
              uVar25 = (uint)(8 < (int)uVar25);
            }
            if ((char)uVar25 != '\0') {
              google::protobuf::internal::LogMessage::LogMessage
                        (local_2c0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xca2);
              pLVar14 = (LogMessage *)
                        google::protobuf::internal::LogMessage::operator<<
                                  (local_2c0,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
              google::protobuf::internal::LogFinisher::operator=
                        ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 8),pLVar14);
              google::protobuf::internal::LogMessage::~LogMessage(local_2c0);
            }
            iVar9 = local_34[0];
            iVar10 = HasBitIndex(local_40,*(fields->
                                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
            iVar24 = iVar10 + 0x1f;
            if (-1 < iVar10) {
              iVar24 = iVar10;
            }
            iVar24 = iVar24 >> 5;
            if (iVar10 == -1) {
              iVar24 = -1;
            }
            if (iVar9 != iVar24) {
              local_34[0] = iVar24;
              Formatter::operator()
                        ((Formatter *)local_100,"cached_has_bits = from._has_bits_[$1$];\n",local_34
                        );
            }
            Formatter::operator()
                      ((Formatter *)local_100,"if (cached_has_bits & 0x$1$u) {\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
            google::protobuf::io::Printer::Indent();
            if (local_a8 != (undefined1  [8])psVar23) {
              operator_delete((void *)local_a8);
            }
          }
          ppFVar26 = (fields->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          ppFVar3 = (fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if (ppFVar26 == ppFVar3) {
            uVar11 = 0;
          }
          else {
            local_50 = 0;
            do {
              pFVar4 = *ppFVar26;
              pFVar15 = FieldGeneratorMap::get(pFVar13,pFVar4);
              iVar9 = local_34[0];
              iVar24 = *(int *)(pFVar4 + 0x3c);
              if (iVar24 == 3) {
                (*pFVar15->_vptr_FieldGenerator[0xc])(pFVar15,local_48);
              }
              else if ((iVar24 == 1) &&
                      (((pFVar4[0x41] == (FieldDescriptor)0x0 &&
                        ((*(int *)(*(long *)(pFVar4 + 0x28) + 0x3c) != 2 ||
                         (*(long *)(pFVar4 + 0x58) != 0)))) ||
                       (*(char *)(*(long *)(pFVar4 + 0x78) + 0x4f) == '\x01')))) {
                chunk_mask_str.field_2._8_8_ = local_78;
                psVar2 = (string *)((long)&chunk_mask_str.field_2 + 8);
                std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"from.","");
                bVar8 = anon_unknown_0::EmitFieldNonDefaultCondition(local_48,psVar2,pFVar4);
                if ((undefined1 *)chunk_mask_str.field_2._8_8_ != local_78) {
                  operator_delete((void *)chunk_mask_str.field_2._8_8_);
                }
                (*pFVar15->_vptr_FieldGenerator[0xc])(pFVar15,local_48);
                if (bVar8) {
                  google::protobuf::io::Printer::Outdent();
                  Formatter::operator()<>((Formatter *)local_100,"}\n");
                }
              }
              else {
                bVar22 = *(byte *)(*(long *)(pFVar4 + 0x78) + 0x4f);
                field = extraout_RDX;
                if (bVar22 == 0) {
                  iVar12 = HasBitIndex(local_40,pFVar4);
                  iVar10 = iVar12 + 0x1f;
                  if (-1 < iVar12) {
                    iVar10 = iVar12;
                  }
                  iVar10 = iVar10 >> 5;
                  if (iVar12 == -1) {
                    iVar10 = -1;
                  }
                  field = extraout_RDX_00;
                  if (iVar9 == iVar10) {
                    if (pFVar4[0x41] == (FieldDescriptor)0x0) {
                      if ((iVar24 != 1) || (*(int *)(*(long *)(pFVar4 + 0x28) + 0x3c) != 2)) {
                        if (iVar24 != 2) goto LAB_001e465a;
                        goto LAB_001e4488;
                      }
                      if (*(long *)(pFVar4 + 0x58) == 0) goto LAB_001e4488;
LAB_001e465a:
                      bVar8 = false;
                    }
                    else {
LAB_001e4488:
                      bVar8 = true;
                    }
                    if (!bVar8) {
                      google::protobuf::internal::LogMessage::LogMessage
                                (local_250,LOGLEVEL_DFATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                                 ,0xcca);
                      pLVar14 = (LogMessage *)
                                google::protobuf::internal::LogMessage::operator<<
                                          (local_250,"CHECK failed: HasHasbit(field): ");
                      google::protobuf::internal::LogFinisher::operator=
                                ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 8),pLVar14);
                      google::protobuf::internal::LogMessage::~LogMessage(local_250);
                    }
                    if (pFVar4[0x43] == (FieldDescriptor)0x0) {
                      plVar21 = (long *)(*(long *)(pFVar4 + 0x50) + 0x28);
                    }
                    else if (*(long *)(pFVar4 + 0x60) == 0) {
                      plVar21 = (long *)(*(long *)(pFVar4 + 0x28) + 0x80);
                    }
                    else {
                      plVar21 = (long *)(*(long *)(pFVar4 + 0x60) + 0x50);
                    }
                    piVar6 = (has_bit_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    uVar16 = CONCAT71((int7)((ulong)piVar6 >> 8),
                                      (char)piVar6[(int)((ulong)((long)pFVar4 - *plVar21) >> 3) *
                                                   0x286bca1b]) & 0xffffffffffffff1f;
                    HVar30.value = 1L << (sbyte)uVar16;
                    HVar30._8_8_ = 8;
                    google::protobuf::strings::AlphaNum::AlphaNum
                              ((AlphaNum *)((long)&chunk_mask_str.field_2 + 8),HVar30);
                    local_a8 = (undefined1  [8])&chunk_mask_str._M_string_length;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_a8,chunk_mask_str.field_2._8_8_,
                               local_80 + chunk_mask_str.field_2._8_8_);
                    Formatter::operator()
                              ((Formatter *)local_100,"if (cached_has_bits & 0x$1$u) {\n",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a8);
                    google::protobuf::io::Printer::Indent();
                    if (((char)local_4c == '\0') || (bVar8 = anon_unknown_0::IsPOD(pFVar4), !bVar8))
                    {
                      (*pFVar15->_vptr_FieldGenerator[0xc])(pFVar15,local_48);
                    }
                    else {
                      local_50 = (uint)CONCAT71((int7)(uVar16 >> 8),1);
                      (*pFVar15->_vptr_FieldGenerator[0xd])(pFVar15,local_48);
                    }
                    google::protobuf::io::Printer::Outdent();
                    Formatter::operator()<>((Formatter *)local_100,"}\n");
                    if (local_a8 != (undefined1  [8])&chunk_mask_str._M_string_length) {
                      operator_delete((void *)local_a8);
                    }
                    goto LAB_001e461e;
                  }
                }
                if (pFVar4[0x41] == (FieldDescriptor)0x0) {
                  if ((iVar24 != 1) || (*(int *)(*(long *)(pFVar4 + 0x28) + 0x3c) != 2)) {
                    if (iVar24 != 2) goto LAB_001e4558;
                    goto LAB_001e449a;
                  }
                  if (*(long *)(pFVar4 + 0x58) == 0) goto LAB_001e449a;
LAB_001e4558:
                  bVar22 = 0;
                }
                else {
LAB_001e449a:
                  bVar22 = bVar22 ^ 1;
                }
                if (bVar22 == 0) {
                  google::protobuf::internal::LogMessage::LogMessage
                            (local_288,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                             ,0xcc2);
                  pLVar14 = (LogMessage *)
                            google::protobuf::internal::LogMessage::operator<<
                                      (local_288,"CHECK failed: HasHasbit(field): ");
                  google::protobuf::internal::LogFinisher::operator=
                            ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 8),pLVar14);
                  google::protobuf::internal::LogMessage::~LogMessage(local_288);
                  field = extraout_RDX_01;
                }
                psVar2 = (string *)((long)&chunk_mask_str.field_2 + 8);
                FieldName_abi_cxx11_(psVar2,(cpp *)pFVar4,field);
                Formatter::operator()
                          ((Formatter *)local_100,"if (from._internal_has_$1$()) {\n",psVar2);
                if ((undefined1 *)chunk_mask_str.field_2._8_8_ != local_78) {
                  operator_delete((void *)chunk_mask_str.field_2._8_8_);
                }
                google::protobuf::io::Printer::Indent();
                (*pFVar15->_vptr_FieldGenerator[0xc])(pFVar15,local_48);
                google::protobuf::io::Printer::Outdent();
                Formatter::operator()<>((Formatter *)local_100,"}\n");
              }
LAB_001e461e:
              ppFVar26 = ppFVar26 + 1;
              uVar11 = local_50;
            } while (ppFVar26 != ppFVar3);
          }
          if ((char)local_4c != '\0') {
            if ((uVar11 & 1) != 0) {
              if (local_34[0] < 0) {
                google::protobuf::internal::LogMessage::LogMessage
                          (local_218,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xce2);
                pLVar14 = (LogMessage *)
                          google::protobuf::internal::LogMessage::operator<<
                                    (local_218,"CHECK failed: (0) <= (cached_has_word_index): ");
                google::protobuf::internal::LogFinisher::operator=
                          ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 8),pLVar14);
                google::protobuf::internal::LogMessage::~LogMessage(local_218);
              }
              Formatter::operator()
                        ((Formatter *)local_100,"_has_bits_[$1$] |= cached_has_bits;\n",local_34);
            }
            google::protobuf::io::Printer::Outdent();
            Formatter::operator()<>((Formatter *)local_100,"}\n");
          }
          bVar8 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                            ((ColdChunkSkipper *)local_1e0,(int)uVar19,local_48);
          if (bVar8) {
            local_34[0] = -1;
          }
          uVar19 = uVar19 + 1;
          uVar16 = ((long)((long)chunks.
                                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                          format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count) >> 3) *
                   -0x5555555555555555;
        } while (uVar19 <= uVar16 && uVar16 - uVar19 != 0);
      }
      __end3._0_8_ = local_40->descriptor_;
      local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           *(undefined4 *)(__end3._0_8_ + 0x70);
      pFVar13 = &local_40->field_generators_;
      psVar2 = (string *)(&chunk_mask_str.field_2._M_allocated_capacity + 1);
      chunk_mask_str._M_dataplus._M_p = (pointer)__end3._0_8_;
      while (bVar8 = operator==((Iterator *)local_a8,
                                (Iterator *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count),
            !bVar8) {
        lVar17 = (long)(int)local_a8._0_4_;
        lVar20 = *(long *)(chunk_mask_str._M_dataplus._M_p + 0x30);
        Formatter::operator()
                  ((Formatter *)local_100,"switch (from.$1$_case()) {\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar20 + lVar17 * 0x30));
        google::protobuf::io::Printer::Indent();
        plVar21 = (long *)(lVar20 + lVar17 * 0x30);
        __end4.descriptor._0_4_ = 0;
        __end3.descriptor._0_4_ = (undefined4)plVar21[3];
        __end4._0_8_ = plVar21;
        while (bVar8 = operator==((Iterator *)&__end4.descriptor,(Iterator *)&__end3.descriptor),
              !bVar8) {
          pFVar4 = *(FieldDescriptor **)(plVar21[4] + (long)(int)__end4.descriptor * 8);
          UnderscoresToCamelCase(psVar2,*(string **)pFVar4,true);
          Formatter::operator()((Formatter *)local_100,"case k$1$: {\n",psVar2);
          if ((undefined1 *)chunk_mask_str.field_2._8_8_ != local_78) {
            operator_delete((void *)chunk_mask_str.field_2._8_8_);
          }
          google::protobuf::io::Printer::Indent();
          pFVar15 = FieldGeneratorMap::get(pFVar13,pFVar4);
          (*pFVar15->_vptr_FieldGenerator[0xc])(pFVar15,local_48);
          Formatter::operator()<>((Formatter *)local_100,"break;\n");
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)local_100,"}\n");
          __end4.descriptor._0_4_ = (int)__end4.descriptor + 1;
        }
        chunk_mask_str.field_2._8_8_ = local_78;
        lVar20 = *(long *)*plVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar2,lVar20,((long *)*plVar21)[1] + lVar20);
        if (local_80 != 0) {
          lVar20 = 0;
          do {
            if ((byte)(*(char *)(chunk_mask_str.field_2._8_8_ + lVar20) + 0x9fU) < 0x1a) {
              *(char *)(chunk_mask_str.field_2._8_8_ + lVar20) =
                   *(char *)(chunk_mask_str.field_2._8_8_ + lVar20) + -0x20;
            }
            lVar20 = lVar20 + 1;
          } while (local_80 != lVar20);
        }
        Formatter::operator()((Formatter *)local_100,"case $1$_NOT_SET: {\n  break;\n}\n",psVar2);
        if ((undefined1 *)chunk_mask_str.field_2._8_8_ != local_78) {
          operator_delete((void *)chunk_mask_str.field_2._8_8_);
        }
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>((Formatter *)local_100,"}\n");
        local_a8._0_4_ = local_a8._0_4_ + 1;
      }
      if (local_40->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  ((Formatter *)local_100,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
      }
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)local_100,"}\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&cold_skipper.cold_threshold_);
      std::
      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&cold_skipper.limit_chunk_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&format);
      return;
    }
    pFVar4 = *ppFVar26;
    local_1e0 = (undefined1  [8])pFVar4;
    if ((pointer)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
LAB_001e40b0:
      if (chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::_M_realloc_insert<>
                  ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,(iterator)0x0);
        uVar27 = extraout_XMM0_Da_00;
        uVar28 = extraout_XMM0_Db_00;
      }
      else {
        uVar27 = 0;
        uVar28 = 0;
        ((chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    else {
      iVar9 = HasBitIndex(this_00,chunks.
                                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1]);
      iVar24 = iVar9 + 7;
      if (-1 < iVar9) {
        iVar24 = iVar9;
      }
      iVar24 = iVar24 >> 3;
      if (iVar9 == -1) {
        iVar24 = -1;
      }
      iVar10 = HasBitIndex(this_00,pFVar4);
      iVar9 = iVar10 + 7;
      if (-1 < iVar10) {
        iVar9 = iVar10;
      }
      iVar9 = iVar9 >> 3;
      if (iVar10 == -1) {
        iVar9 = -1;
      }
      uVar27 = extraout_XMM0_Da;
      uVar28 = extraout_XMM0_Db;
      if (iVar24 != iVar9) goto LAB_001e40b0;
    }
    __position._M_current =
         chunks.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1].
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[-1].
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)(chunks.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1),__position,
                 (FieldDescriptor **)local_1e0);
      uVar27 = extraout_XMM0_Da_01;
      uVar28 = extraout_XMM0_Db_01;
    }
    else {
      *__position._M_current = (FieldDescriptor *)local_1e0;
      pppFVar1 = &chunks.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    ppFVar26 = ppFVar26 + 1;
  } while( true );
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeFrom(io::Printer* printer) {
  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  Formatter format(printer, variables_);
  format(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  $DCHK$_NE(&from, this);\n");
  format.Indent();

  if (descriptor_->extension_range_count() > 0) {
    format("_extensions_.MergeFrom(from._extensions_);\n");
  }
  std::map<std::string, std::string> vars;
  SetUnknkownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);
  format(
      "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
      "metadata_);\n"
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b);
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);

  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    bool have_outer_if =
        chunk.size() > 1 && HasByteIndex(chunk.front()) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "from.",
                              printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32 chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = from._has_bits_[$1$];\n",
               cached_has_word_index);
      }

      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit merging code for each of the fields we processed.
    bool deferred_has_bit_changes = false;
    for (const auto field : chunk) {
      const FieldGenerator& generator = field_generators_.get(field);

      if (field->is_repeated()) {
        generator.GenerateMergingCode(printer);
      } else if (field->is_optional() && !HasHasbit(field)) {
        // Merge semantics without true field presence: primitive fields are
        // merged only if non-zero (numeric) or non-empty (string).
        bool have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "from.", field);
        generator.GenerateMergingCode(printer);
        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      } else if (field->options().weak() ||
                 cached_has_word_index != HasWordIndex(field)) {
        // Check hasbit, not using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        format("if (from._internal_has_$1$()) {\n", FieldName(field));
        format.Indent();
        generator.GenerateMergingCode(printer);
        format.Outdent();
        format("}\n");
      } else {
        // Check hasbit, using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        int has_bit_index = has_bit_indices_[field->index()];
        const std::string mask = StrCat(
            strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
        format("if (cached_has_bits & 0x$1$u) {\n", mask);
        format.Indent();

        if (have_outer_if && IsPOD(field)) {
          // Defer hasbit modification until the end of chunk.
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      if (deferred_has_bit_changes) {
        // Flush the has bits for the primitives we deferred.
        GOOGLE_CHECK_LE(0, cached_has_word_index);
        format("_has_bits_[$1$] |= cached_has_bits;\n", cached_has_word_index);
      }

      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch (from.$1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (IsFieldUsed(field, options_)) {
        field_generators_.get(field).GenerateMergingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }
  if (num_weak_fields_) {
    format("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  format.Outdent();
  format("}\n");
}